

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_TestHarness_c_cpputest_realloc_larger_TestShell::createTest
          (TEST_TestHarness_c_cpputest_realloc_larger_TestShell *this)

{
  TEST_TestHarness_c_cpputest_realloc_larger_Test *this_00;
  
  this_00 = (TEST_TestHarness_c_cpputest_realloc_larger_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                         ,0x316);
  TEST_TestHarness_c_cpputest_realloc_larger_Test::TEST_TestHarness_c_cpputest_realloc_larger_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestHarness_c, cpputest_realloc_larger)
{
    const char* number_string = "123456789";

    char* mem1 = (char*) cpputest_malloc(10);

    SimpleString::StrNCpy(mem1, number_string, 10);

    CHECK(mem1 != NULLPTR);

    char* mem2 = (char*) cpputest_realloc(mem1, 1000);

    CHECK(mem2 != NULLPTR);
    STRCMP_EQUAL(number_string, mem2);

    cpputest_free(mem2);
}